

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.h
# Opt level: O3

void __thiscall
FileReaderData::FileReaderData(FileReaderData *this,uint32_t blockSize,uint32_t allocSize)

{
  (this->super_ReaderData).m_bufferIndex = '\0';
  (this->super_ReaderData).m_notified = false;
  (this->super_ReaderData).m_blockSize = 0;
  (this->super_ReaderData).m_allocSize = 0;
  (this->super_ReaderData).m_nextBlockSize = 0;
  (this->super_ReaderData).m_deleted = false;
  (this->super_ReaderData).m_firstBlock = false;
  (this->super_ReaderData).m_lastBlock = false;
  (this->super_ReaderData).m_eof = false;
  *(undefined8 *)&(this->super_ReaderData).m_atQueue = 0;
  *(undefined4 *)((long)&(this->super_ReaderData).itr + 4) = 0;
  (this->super_ReaderData).m_streamName._M_dataplus._M_p =
       (pointer)&(this->super_ReaderData).m_streamName.field_2;
  (this->super_ReaderData).m_streamName._M_string_length = 0;
  (this->super_ReaderData).m_streamName.field_2._M_local_buf[0] = '\0';
  (this->super_ReaderData).m_readOffset = 0;
  (this->super_ReaderData).m_nextBlock[0] = (uint8_t *)0x0;
  (this->super_ReaderData).m_nextBlock[1] = (uint8_t *)0x0;
  (this->super_ReaderData)._vptr_ReaderData = (_func_int **)&PTR__FileReaderData_0023d038;
  File::File(&this->m_file);
  this->m_fileHeaderSize = 0;
  return;
}

Assistant:

FileReaderData(uint32_t blockSize, uint32_t allocSize) : m_fileHeaderSize(0) {}